

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O1

int lws_add_http2_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar *puVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  
  uVar6 = (ulong)((int)end - (int)*p);
  uVar8 = (long)(length + 1);
  if (uVar6 < (ulong)(long)(length + 1)) {
    uVar8 = uVar6;
  }
  lws_strncpy((char *)*p,(char *)value,uVar8);
  uVar4 = 0;
  _lws_log(0x40,"%s: %p  %s:%s (len %d)\n","lws_add_http2_header_by_name",*p,name,*p,length);
  sVar7 = strlen((char *)name);
  iVar5 = (int)sVar7;
  if (iVar5 != 0) {
    uVar4 = iVar5 - (uint)(name[iVar5 + -1] == ':');
  }
  if (((wsi->field_0x46e & 2) != 0) &&
     (iVar5 = strncmp((char *)name,"transfer-encoding",(ulong)uVar4), iVar5 == 0)) {
    _lws_log(0x40,"rejecting %s\n",name);
    return 0;
  }
  puVar1 = *p;
  iVar5 = 1;
  if ((long)(int)(length + uVar4 + 8) <= (long)end - (long)puVar1) {
    *p = puVar1 + 1;
    *puVar1 = '\0';
    uVar6 = (ulong)(int)uVar4;
    uVar8 = 0x7f;
    if (uVar6 < 0x7f) {
      uVar8 = uVar6;
    }
    puVar1 = *p;
    *p = puVar1 + 1;
    *puVar1 = (uchar)uVar8;
    if (0x7e < uVar4) {
      uVar8 = uVar6 - 0x7f;
      do {
        bVar9 = (byte)uVar8 | 0x80;
        if (uVar8 < 0x80) {
          bVar9 = (byte)uVar8;
        }
        pbVar2 = *p;
        *p = pbVar2 + 1;
        *pbVar2 = bVar9;
        if (end <= *p) {
          return 1;
        }
        bVar3 = 0x7f < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar3);
    }
    if (uVar4 != 0) {
      lVar10 = 0;
      do {
        iVar5 = tolower((uint)name[lVar10]);
        puVar1 = *p;
        *p = puVar1 + 1;
        *puVar1 = (uchar)iVar5;
        lVar10 = lVar10 + 1;
      } while (uVar4 != (uint)lVar10);
    }
    uVar6 = (ulong)length;
    uVar8 = 0x7f;
    if (uVar6 < 0x7f) {
      uVar8 = uVar6;
    }
    puVar1 = *p;
    *p = puVar1 + 1;
    *puVar1 = (uchar)uVar8;
    if (0x7e < (uint)length) {
      uVar8 = uVar6 - 0x7f;
      do {
        bVar9 = (byte)uVar8 | 0x80;
        if (uVar8 < 0x80) {
          bVar9 = (byte)uVar8;
        }
        pbVar2 = *p;
        *p = pbVar2 + 1;
        *pbVar2 = bVar9;
        if (end <= *p) {
          return 1;
        }
        bVar3 = 0x7f < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar3);
    }
    memcpy(*p,value,(ulong)(uint)length);
    *p = *p + uVar6;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int lws_add_http2_header_by_name(struct lws *wsi, const unsigned char *name,
				 const unsigned char *value, int length,
				 unsigned char **p, unsigned char *end)
{
	int len;

#if defined(_DEBUG)
	/* value does not have to be NUL-terminated... %.*s not available on
	 * all platforms */
	lws_strnncpy((char *)*p, (const char *)value, length,
			lws_ptr_diff(end, (*p)));

	lwsl_header("%s: %p  %s:%s (len %d)\n", __func__, *p, name,
			(const char *)*p, length);
#endif

	len = (int)strlen((char *)name);
	if (len)
		if (name[len - 1] == ':')
			len--;

	if (wsi->mux_substream && !strncmp((const char *)name,
					     "transfer-encoding", (unsigned int)len)) {
		lwsl_header("rejecting %s\n", name);

		return 0;
	}

	if (end - *p < len + length + 8)
		return 1;

	*((*p)++) = 0; /* literal hdr, literal name,  */

	*((*p)++) = (uint8_t)(0 | (uint8_t)lws_h2_num_start(7, (unsigned long)len)); /* non-HUF */
	if (lws_h2_num(7, (unsigned long)len, p, end))
		return 1;

	/* upper-case header names are verboten in h2, but OK on h1, so
	 * they're not illegal per se.  Silently convert them for h2... */

	while(len--)
		*((*p)++) = (uint8_t)tolower((int)*name++);

	*((*p)++) = (uint8_t)(0 | (uint8_t)lws_h2_num_start(7, (unsigned long)length)); /* non-HUF */
	if (lws_h2_num(7, (unsigned long)length, p, end))
		return 1;

	memcpy(*p, value, (unsigned int)length);
	*p += length;

	return 0;
}